

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2NullVsEmptyString(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_598;
  undefined1 local_418 [8];
  StringPiece empty;
  undefined1 local_288 [8];
  StringPiece null;
  undefined1 local_e8 [8];
  RE2 re;
  
  RE2::RE2((RE2 *)local_e8,".*");
  bVar1 = RE2::ok((RE2 *)local_e8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&null.length_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x589);
    poVar2 = LogMessage::stream((LogMessage *)&null.length_);
    std::operator<<(poVar2,"Check failed: re.ok()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&null.length_);
  }
  StringPiece::StringPiece((StringPiece *)local_288);
  bVar1 = RE2::FullMatch<>((StringPiece *)local_288,(RE2 *)local_e8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&empty.length_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x58c);
    poVar2 = LogMessage::stream((LogMessage *)&empty.length_);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(null, re)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&empty.length_);
  }
  StringPiece::StringPiece((StringPiece *)local_418,"");
  bVar1 = RE2::FullMatch<>((StringPiece *)local_418,(RE2 *)local_e8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_598,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x58f);
    poVar2 = LogMessage::stream(&local_598);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(empty, re)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_598);
  }
  RE2::~RE2((RE2 *)local_e8);
  return;
}

Assistant:

TEST(RE2, NullVsEmptyString) {
  RE2 re(".*");
  EXPECT_TRUE(re.ok());

  StringPiece null;
  EXPECT_TRUE(RE2::FullMatch(null, re));

  StringPiece empty("");
  EXPECT_TRUE(RE2::FullMatch(empty, re));
}